

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void write_dec_ref_base_pic_marking(nal_t *nal,bs_t *b)

{
  _Bool _Var1;
  byte *pbVar2;
  prefix_nal_svc_t *ppVar3;
  int iVar4;
  uint32_t v;
  
  _Var1 = nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag;
  iVar4 = b->bits_left + -1;
  b->bits_left = iVar4;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | _Var1 << ((byte)b->bits_left & 0x1f);
    iVar4 = b->bits_left;
  }
  if (iVar4 == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
  }
  if (nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag == true) {
    v = nal->prefix_nal_svc->memory_management_base_control_operation;
    do {
      bs_write_ue(b,v);
      ppVar3 = nal->prefix_nal_svc;
      v = ppVar3->memory_management_base_control_operation;
      if (v == 1) {
        bs_write_ue(b,ppVar3->difference_of_base_pic_nums_minus1);
        ppVar3 = nal->prefix_nal_svc;
        v = ppVar3->memory_management_base_control_operation;
      }
      if (v == 2) {
        bs_write_ue(b,ppVar3->long_term_base_pic_num);
        v = nal->prefix_nal_svc->memory_management_base_control_operation;
      }
    } while (v != 0);
  }
  return;
}

Assistant:

void write_dec_ref_base_pic_marking(nal_t* nal, bs_t* b)
{
    bs_write_u1(b, nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag);
    if( nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag )
    {
        do {
            bs_write_ue(b, nal->prefix_nal_svc->memory_management_base_control_operation);
            
            if( nal->prefix_nal_svc->memory_management_base_control_operation == 1 )
            {
                bs_write_ue(b, nal->prefix_nal_svc->difference_of_base_pic_nums_minus1);
            }
            if( nal->prefix_nal_svc->memory_management_base_control_operation == 2 )
            {
                bs_write_ue(b, nal->prefix_nal_svc->long_term_base_pic_num);
            }
        } while( nal->prefix_nal_svc->memory_management_base_control_operation != 0 );
    }
}